

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O0

void __thiscall nonius::reporter::configure(reporter *this,configuration *cfg)

{
  ulong uVar1;
  ostream *poVar2;
  void *__s;
  undefined8 in_RSI;
  long *in_RDI;
  shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_> ofs;
  shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_> *in_stack_ffffffffffffff98;
  bad_stream *in_stack_ffffffffffffffa0;
  anon_class_1_0_00000001 *in_stack_ffffffffffffffb8;
  function<std::basic_ostream<char,_std::char_traits<char>_>_&()> *in_stack_ffffffffffffffc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  bad_stream local_28 [3];
  undefined8 local_10;
  
  local_10 = in_RSI;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    in_stack_ffffffffffffffa0 = local_28;
    std::make_shared<std::ofstream,std::__cxx11::string&>(in_stack_ffffffffffffffc8);
    std::shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_>::shared_ptr
              ((shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_> *)
               in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    std::function<std::ostream&()>::operator=
              (in_stack_ffffffffffffffc0,(anon_class_16_1_ba1d68dc *)in_stack_ffffffffffffffb8);
    configure(nonius::configuration&)::{lambda()#2}::~configuration
              ((anon_class_16_1_ba1d68dc *)0x217f7c);
    std::shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_>::~shared_ptr
              ((shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_> *)0x217f86);
  }
  else {
    std::function<std::ostream&()>::operator=(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  poVar2 = report_stream((reporter *)0x217fb9);
  std::ios::exceptions((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
  poVar2 = report_stream((reporter *)0x217fd7);
  uVar1 = std::ios::operator!((ios *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18)));
  if ((uVar1 & 1) == 0) {
    (**(code **)(*in_RDI + 0x18))(in_RDI,local_10);
    return;
  }
  __s = (void *)__cxa_allocate_exception(8);
  memset(__s,0,8);
  bad_stream::bad_stream(in_stack_ffffffffffffffa0);
  __cxa_throw(__s,&bad_stream::typeinfo,bad_stream::~bad_stream);
}

Assistant:

void configure(configuration& cfg) {
            if(cfg.output_file.empty()) {
                os = [&]() -> std::ostream& { return std::cout; };
            } else {
                auto ofs = std::make_shared<std::ofstream>(cfg.output_file);
                os = [ofs]() -> std::ostream& { return *ofs; };
            }
            report_stream().exceptions(std::ios::failbit);
            if(!report_stream()) throw bad_stream();
            do_configure(cfg);
        }